

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoke_test.cxx
# Opt level: O2

void local_sum(Block *b,ProxyWithLink *cp)

{
  Link *pLVar1;
  pointer piVar2;
  pointer pBVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  uint uVar7;
  int i;
  long lVar8;
  long lVar9;
  int total;
  ProxyWithLink *local_38;
  
  pLVar1 = cp->link_;
  total = 0;
  piVar2 = (b->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (uVar7 = 0; iVar4 = total,
      (ulong)uVar7 <
      (ulong)((long)(b->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2 >> 2); uVar7 = uVar7 + 1) {
    total = total + piVar2[uVar7];
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Total     (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(cp->super_Proxy).gid_);
  poVar5 = std::operator<<(poVar5,"): ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar9 = 0;
  local_38 = cp;
  for (lVar8 = 0;
      pBVar3 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(pLVar1->neighbors_).
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3);
      lVar8 = lVar8 + 1) {
    pmVar6 = std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::operator[](&(cp->super_Proxy).outgoing_,(key_type *)((long)&pBVar3->gid + lVar9));
    (*(pmVar6->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar6,&total,4);
    lVar9 = lVar9 + 8;
  }
  diy::Master::Proxy::all_reduce<int,std::plus<int>>(&local_38->super_Proxy,&total);
  return;
}

Assistant:

void local_sum(Block* b,                             // local block
               const diy::Master::ProxyWithLink& cp) // communication proxy
{
    diy::Link*    l = cp.link();

    // compute local sum
    int total = 0;
    for (unsigned i = 0; i < b->values.size(); ++i)
        total += b->values[i];

    std::cout << "Total     (" << cp.gid() << "): " << total        << std::endl;

    // for all neighbor blocks
    // enqueue data to be sent to this neighbor block in the next exchange
    for (int i = 0; i < l->size(); ++i)
        cp.enqueue(l->target(i), total);

    // diy collectives (optional) are piggybacking on the enqueue/exchange/dequeue mechanism.
    // They are invoked by posting the collective at the time of the enqueue and getting the
    // result at the time of the dequeue.
    // all_reduce() is the posting of the collective.
    cp.all_reduce(total, std::plus<int>());
}